

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O3

size_t __thiscall
capnp::_::anon_unknown_0::TestPipe::tryRead
          (TestPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  ulong __n;
  Fault f;
  Fault local_18;
  
  if (maxBytes <= (this->data)._M_string_length - this->readPos) {
    __n = this->preferredReadSize;
    if (this->preferredReadSize < minBytes) {
      __n = minBytes;
    }
    if (maxBytes < __n) {
      __n = maxBytes;
    }
    memcpy(buffer,(this->data)._M_dataplus._M_p + this->readPos,__n);
    this->readPos = this->readPos + __n;
    return __n;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
             ,0x42,FAILED,"maxBytes <= data.size() - readPos","\"Overran end of stream.\"",
             (char (*) [23])"Overran end of stream.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

size_t tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_ASSERT(maxBytes <= data.size() - readPos, "Overran end of stream.");
    size_t amount = kj::min(maxBytes, kj::max(minBytes, preferredReadSize));
    memcpy(buffer, data.data() + readPos, amount);
    readPos += amount;
    return amount;
  }